

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tree_Item.H
# Opt level: O1

int __thiscall Fl_Tree::is_close(Fl_Tree *this,Fl_Tree_Item *item)

{
  return (int)(item->_open == '\0');
}

Assistant:

int is_flag(unsigned short flag) const {
    switch (flag) {
      case     OPEN: return(_open ? 1 : 0);
      case  VISIBLE: return(_visible ? 1 : 0);
      case   ACTIVE: return(_active ? 1 : 0);
      case SELECTED: return(_selected ? 1 : 0);
      default:       return(0);
    }
  }